

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarDemiter(Abc_Ntk_t *pNtk)

{
  int iVar1;
  char *local_818;
  Aig_Man_t *local_810;
  Aig_Man_t *pPart1;
  Aig_Man_t *pPart0;
  Aig_Man_t *pMan;
  char pFileName1 [1000];
  char local_408 [8];
  char pFileName0 [1000];
  char *pFileNameGeneric;
  Abc_Ntk_t *pNtk_local;
  
  pPart0 = Abc_NtkToDar(pNtk,0,1);
  if (pPart0 == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Converting network into AIG has failed.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    iVar1 = Saig_ManDemiterSimpleDiff(pPart0,&pPart1,&local_810);
    if (iVar1 == 0) {
      Aig_ManStop(pPart0);
      Abc_Print(1,"Demitering has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      if (pNtk->pSpec == (char *)0x0) {
        local_818 = pNtk->pName;
      }
      else {
        local_818 = pNtk->pSpec;
      }
      pFileName0._992_8_ = Extra_FileNameGeneric(local_818);
      sprintf(local_408,"%s","part0.aig");
      sprintf((char *)&pMan,"%s","part1.aig");
      if (pFileName0._992_8_ != 0) {
        free((void *)pFileName0._992_8_);
        pFileName0[0x3e0] = '\0';
        pFileName0[0x3e1] = '\0';
        pFileName0[0x3e2] = '\0';
        pFileName0[0x3e3] = '\0';
        pFileName0[0x3e4] = '\0';
        pFileName0[0x3e5] = '\0';
        pFileName0[0x3e6] = '\0';
        pFileName0[999] = '\0';
      }
      Ioa_WriteAiger(pPart1,local_408,0,0);
      Ioa_WriteAiger(local_810,(char *)&pMan,0,0);
      Abc_Print(1,"Demitering produced two files \"%s\" and \"%s\".\n",local_408,&pMan);
      Aig_ManStop(pPart1);
      Aig_ManStop(local_810);
      Aig_ManStop(pPart0);
      pNtk_local._4_4_ = 1;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarDemiter( Abc_Ntk_t * pNtk )
{ 
    char * pFileNameGeneric, pFileName0[1000], pFileName1[1000];
    Aig_Man_t * pMan, * pPart0, * pPart1;//, * pMiter;
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting network into AIG has failed.\n" );
        return 0;
    }
//    if ( !Saig_ManDemiterSimple( pMan, &pPart0, &pPart1 ) )
    if ( !Saig_ManDemiterSimpleDiff( pMan, &pPart0, &pPart1 ) )
    {
        Aig_ManStop( pMan );
        Abc_Print( 1, "Demitering has failed.\n" );
        return 0;
    }
    // create file names
    pFileNameGeneric = Extra_FileNameGeneric( pNtk->pSpec ? pNtk->pSpec : pNtk->pName );
//    sprintf( pFileName0,  "%s%s",  pFileNameGeneric, "_part0.aig" ); 
//    sprintf( pFileName1,  "%s%s",  pFileNameGeneric, "_part1.aig" ); 
    sprintf( pFileName0,  "%s",  "part0.aig" ); 
    sprintf( pFileName1,  "%s",  "part1.aig" ); 
    ABC_FREE( pFileNameGeneric );
    // dump files
    Ioa_WriteAiger( pPart0, pFileName0, 0, 0 );
    Ioa_WriteAiger( pPart1, pFileName1, 0, 0 );
    Abc_Print( 1, "Demitering produced two files \"%s\" and \"%s\".\n", pFileName0, pFileName1 );
    // create two-level miter
//    pMiter = Saig_ManCreateMiterTwo( pPart0, pPart1, 2 );
//    Aig_ManDumpBlif( pMiter, "miter01.blif", NULL, NULL );
//    Aig_ManStop( pMiter );
//    Abc_Print( 1, "The new miter is written into file \"%s\".\n", "miter01.blif" );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    Aig_ManStop( pMan );
    return 1;
}